

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_GetSetY_Test::TestBody(Image_GetSetY_Test *this)

{
  Point2i p;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  PixelFormat format;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  Allocator alloc;
  long lVar5;
  int y;
  long lVar6;
  char *pcVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar8;
  ColorEncodingHandle *encoding;
  int x;
  long lVar9;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar10;
  long lVar11;
  undefined1 auVar12 [16];
  Float FVar13;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  AssertionResult gtest_ar__1;
  Float v;
  AssertionResult gtest_ar_;
  ImageChannelValues cv;
  ImageChannelDesc yDesc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> yPixels;
  Image image;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  AssertHelper local_248;
  Float local_23c;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_238;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_208;
  PixelFormat local_1d4;
  ImageChannelDesc local_1d0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a0;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  ColorEncodingHandle local_160;
  PixelFormat local_154 [3];
  Image local_148;
  
  GetFloatPixels(&local_1a0,(Point2i)0x300000009,1);
  local_154[0] = U256;
  local_154[1] = Half;
  local_154[2] = 2;
  lVar5 = 0;
  do {
    paVar10 = &local_1d0.offset.field_2;
    format = *(PixelFormat *)((long)local_154 + lVar5);
    local_1d0.offset.alloc.memoryResource = (memory_resource *)paVar10;
    local_178 = lVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Y","");
    local_160.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_160;
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0;
    pbrt::Image::Image(&local_148,format,(Point2i)0x300000009,channels,encoding,alloc);
    local_1d4 = format;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)local_1d0.offset.alloc.memoryResource != paVar10) {
      operator_delete(local_1d0.offset.alloc.memoryResource,local_1d0.offset.field_2._0_8_ + 1);
    }
    lVar5 = 0;
    lVar11 = 0;
    lVar6 = 0;
    do {
      lVar9 = 0;
      do {
        pbrt::Image::SetChannel
                  (&local_148,(Point2i)(lVar5 + lVar9),0,
                   *(Float *)((long)local_1a0.ptr + lVar9 * 4 + lVar11));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 9);
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + 0x24;
      lVar5 = lVar5 + 0x100000000;
    } while (lVar6 != 3);
    paVar1 = &local_208.field_2;
    local_208.alloc.memoryResource = (memory_resource *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Y","");
    requestedChannels.n = 1;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
    pbrt::Image::GetChannelDesc(&local_1d0,&local_148,requestedChannels);
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)local_208.alloc.memoryResource != paVar1) {
      operator_delete(local_208.alloc.memoryResource,local_208.field_2._0_8_ + 1);
    }
    local_238.alloc.memoryResource._0_1_ = local_1d0.offset.nStored != 0;
    local_238.ptr = (float *)0x0;
    if (local_1d0.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_208,(internal *)&local_238,(AssertionResult *)"bool(yDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x74,(char *)local_208.alloc.memoryResource);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_208.alloc.memoryResource != paVar1) {
        operator_delete(local_208.alloc.memoryResource,local_208.field_2._0_8_ + 1);
      }
      if (local_258.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_258.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_258.ptr_ + 8))();
        }
        local_258.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_238.ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_238.alloc.memoryResource = (memory_resource *)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Y0L0","");
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)&local_208,&local_148,requestedChannels_00);
    local_258.ptr_._0_1_ =
         (internal)
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_208.nStored ==
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_250.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_208.nStored = 0;
    (**(code **)(*(long *)&(local_208.alloc.memoryResource)->_vptr_memory_resource + 0x18))
              (local_208.alloc.memoryResource,local_208.ptr,local_208.nAlloc << 2);
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)local_238.alloc.memoryResource != &local_238.field_2) {
      operator_delete(local_238.alloc.memoryResource,local_238.field_2._0_8_ + 1);
    }
    if (local_258.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_238);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_208,(internal *)&local_258,
                 (AssertionResult *)"bool(image.GetChannelDesc({\"Y0L0\"}))","true","false",
                 (char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x75,(char *)local_208.alloc.memoryResource);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_208.alloc.memoryResource != paVar1) {
        operator_delete(local_208.alloc.memoryResource,local_208.field_2._0_8_ + 1);
      }
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)local_238.alloc.memoryResource !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
           *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_238.alloc.memoryResource !=
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0)) {
          (**(code **)(*(long *)&(local_238.alloc.memoryResource)->_vptr_memory_resource + 8))();
        }
        local_238.alloc.memoryResource = (memory_resource *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_180 = 0;
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar11 = 0;
      local_170 = lVar5;
      local_168 = lVar6;
      do {
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_180 + lVar11);
        local_23c = pbrt::Image::GetChannel(&local_148,p,0,(WrapMode2D)0x200000002);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&local_208,&local_148,p,(WrapMode2D)0x200000002);
        local_248.data_._0_4_ = 1;
        local_258.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_208.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_238,"1","cv.size()",(int *)&local_248,
                   (unsigned_long *)&local_258);
        if ((char)local_238.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_258);
          pcVar7 = "";
          if (local_238.ptr != (float *)0x0) {
            pcVar7 = *(char **)local_238.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7b,pcVar7);
          testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          if (local_258.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_258.ptr_ + 8))();
            }
            local_258.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_238.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)local_208.ptr;
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_208.ptr ==
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar8 = paVar1;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_238,"v","cv[0]",&local_23c,paVar8->fixed);
        if ((char)local_238.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_258);
          pcVar7 = "";
          if (local_238.ptr != (float *)0x0) {
            pcVar7 = *(char **)local_238.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7c,pcVar7);
          testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          if (local_258.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_258.ptr_ + 8))();
            }
            local_258.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_238.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)&local_238,&local_148,p,&local_1d0,(WrapMode2D)0x200000002)
        ;
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_208,&local_238);
        local_238.nStored = 0;
        (**(code **)(*(long *)&(local_238.alloc.memoryResource)->_vptr_memory_resource + 0x18))
                  (local_238.alloc.memoryResource,local_238.ptr,local_238.nAlloc << 2,4);
        local_248.data_._0_4_ = 1;
        local_258.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_208.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&local_238,"1","cv.size()",(int *)&local_248,
                   (unsigned_long *)&local_258);
        if ((char)local_238.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_258);
          pcVar7 = "";
          if (local_238.ptr != (float *)0x0) {
            pcVar7 = *(char **)local_238.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x7f,pcVar7);
          testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          if (local_258.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_258.ptr_ + 8))();
            }
            local_258.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_238.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)local_208.ptr;
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)local_208.ptr ==
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar8 = paVar1;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_238,"v","cv[0]",&local_23c,paVar8->fixed);
        if ((char)local_238.alloc.memoryResource == '\0') {
          testing::Message::Message((Message *)&local_258);
          pcVar7 = "";
          if (local_238.ptr != (float *)0x0) {
            pcVar7 = *(char **)local_238.ptr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x80,pcVar7);
          testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          if (local_258.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_258.ptr_ + 8))();
            }
            local_258.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_238.ptr,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_1d4 == U256) {
          auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                               ZEXT416(*(uint *)((long)local_1a0.ptr + lVar6)));
          uVar2 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1a0.ptr + lVar6)),ZEXT816(0) << 0x40,
                                 1);
          auVar3._8_4_ = 0x7fffffff;
          auVar3._0_8_ = 0x7fffffff7fffffff;
          auVar3._12_4_ = 0x7fffffff;
          auVar12 = vandps_avx512vl(ZEXT416((uint)(local_23c -
                                                  (float)((uint)!(bool)((byte)uVar2 & 1) *
                                                         auVar12._0_4_))),auVar3);
          local_258.ptr_._0_4_ = (Float)auVar12._0_4_;
          local_248.data_._0_4_ = 0x3b00c24b;
          testing::internal::CmpHelperLT<float,float>
                    ((internal *)&local_238,"std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1))",
                     "0.501f / 255.f",(float *)&local_258,(float *)&local_248);
          if ((char)local_238.alloc.memoryResource == '\0') {
            testing::Message::Message((Message *)&local_258);
            std::ostream::_M_insert<double>((double)local_23c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_258.ptr_ + 0x10)," vs ",4);
            auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)local_1a0.ptr + lVar6)));
            uVar2 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1a0.ptr + lVar6)),
                                   ZEXT816(0) << 0x40,1);
            std::ostream::_M_insert<double>
                      ((double)(float)((uint)!(bool)((byte)uVar2 & 1) * auVar12._0_4_));
            pcVar7 = "";
            if (local_238.ptr != (float *)0x0) {
              pcVar7 = *(char **)local_238.ptr;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x84,pcVar7);
            testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            if (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_258.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_258.ptr_ + 8))();
              }
              local_258.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_238.ptr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          FVar13 = modelQuantization(*(Float *)((long)local_1a0.ptr + lVar6),local_1d4);
          local_258.ptr_._0_4_ = FVar13;
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&local_238,"v","modelQuantization(yPixels[y * res[0] + x], format)"
                     ,&local_23c,(float *)&local_258);
          if ((char)local_238.alloc.memoryResource == '\0') {
            testing::Message::Message((Message *)&local_258);
            pcVar7 = "";
            if (local_238.ptr != (float *)0x0) {
              pcVar7 = *(char **)local_238.ptr;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x87,pcVar7);
            testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_258);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            if (local_258.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_258.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_258.ptr_ + 8))();
              }
              local_258.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_238.ptr,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        local_208.nStored = 0;
        (**(code **)(*(long *)&(local_208.alloc.memoryResource)->_vptr_memory_resource + 0x18))
                  (local_208.alloc.memoryResource,local_208.ptr,local_208.nAlloc << 2,4);
        lVar11 = lVar11 + 1;
        lVar6 = lVar6 + 4;
      } while (lVar11 != 9);
      lVar5 = local_170 + 1;
      lVar6 = local_168 + 0x24;
      local_180 = local_180 + 0x100000000;
    } while (lVar5 != 3);
    local_1d0.offset.nStored = 0;
    (**(code **)(*(long *)local_1d0.offset.alloc.memoryResource + 0x18))
              (local_1d0.offset.alloc.memoryResource,local_1d0.offset.ptr,
               local_1d0.offset.nAlloc << 2,4);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar5 = local_178 + 4;
  } while (lVar5 != 0xc);
  local_1a0.nStored = 0;
  (*(local_1a0.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1a0.alloc.memoryResource,local_1a0.ptr,local_1a0.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, GetSetY) {
    Point2i res(9, 3);
    pstd::vector<float> yPixels = GetFloatPixels(res, 1);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"Y"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                image.SetChannel({x, y}, 0, yPixels[y * res[0] + x]);
            }

        ImageChannelDesc yDesc = image.GetChannelDesc({"Y"});
        EXPECT_TRUE(bool(yDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"Y0L0"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                Float v = image.GetChannel({x, y}, 0);
                ImageChannelValues cv = image.GetChannels({x, y});
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                cv = image.GetChannels({x, y}, yDesc);
                EXPECT_EQ(1, cv.size());
                EXPECT_EQ(v, cv[0]);

                if (format == PixelFormat::U256)
                    EXPECT_LT(std::abs(v - Clamp(yPixels[y * res[0] + x], 0, 1)),
                              0.501f / 255.f)
                        << v << " vs " << Clamp(yPixels[y * res[0] + x], 0, 1);
                else
                    EXPECT_EQ(v, modelQuantization(yPixels[y * res[0] + x], format));
            }
    }
}